

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

bool anon_unknown.dwarf_104a0d2::ParseDouble(string *str,double *out)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  const_reference pvVar4;
  double *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  double result;
  istringstream text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2d;
  undefined1 in_stack_fffffffffffffe2e;
  byte bVar5;
  undefined1 in_stack_fffffffffffffe2f;
  string *in_stack_fffffffffffffe30;
  bool local_199;
  double local_198;
  locale local_190;
  istringstream local_188 [384];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ParsePrechecks(in_stack_fffffffffffffe30);
  if (bVar1) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_fffffffffffffe18);
    if (((sVar3 < 2) ||
        (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffe2f,
                                      CONCAT16(in_stack_fffffffffffffe2e,
                                               CONCAT15(in_stack_fffffffffffffe2d,
                                                        CONCAT14(in_stack_fffffffffffffe2c,
                                                                 in_stack_fffffffffffffe28)))),
                             in_stack_fffffffffffffe20), *pvVar4 != '0')) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe2f,
                                     CONCAT16(in_stack_fffffffffffffe2e,
                                              CONCAT15(in_stack_fffffffffffffe2d,
                                                       CONCAT14(in_stack_fffffffffffffe2c,
                                                                in_stack_fffffffffffffe28)))),
                            in_stack_fffffffffffffe20), *pvVar4 != 'x')) {
      std::__cxx11::istringstream::istringstream(local_188,in_RDI,_S_in);
      std::locale::classic();
      std::ios::imbue(&local_190);
      std::locale::~locale(&local_190);
      std::istream::operator>>(local_188,&local_198);
      if (in_RSI != (double *)0x0) {
        *in_RSI = local_198;
      }
      bVar2 = std::ios::eof();
      bVar5 = 0;
      if ((bVar2 & 1) != 0) {
        bVar5 = std::ios::fail();
        bVar5 = bVar5 ^ 0xff;
      }
      local_199 = (bool)(bVar5 & 1);
      std::__cxx11::istringstream::~istringstream(local_188);
    }
    else {
      local_199 = false;
    }
  }
  else {
    local_199 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_199;
}

Assistant:

bool ParseDouble(const std::string& str, double *out)
{
    if (!ParsePrechecks(str))
        return false;
    if (str.size() >= 2 && str[0] == '0' && str[1] == 'x') // No hexadecimal floats allowed
        return false;
    std::istringstream text(str);
    text.imbue(std::locale::classic());
    double result;
    text >> result;
    if(out) *out = result;
    return text.eof() && !text.fail();
}